

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# span_suite.cpp
# Opt level: O1

void api_dynamic_suite::dynamic_operator_index_const(void)

{
  int array [4];
  undefined4 local_38;
  undefined4 uStack_34;
  undefined4 uStack_30;
  undefined4 auStack_2c [4];
  undefined4 local_1c;
  
  local_38 = 0xb;
  uStack_34 = 0x16;
  uStack_30 = 0x21;
  auStack_2c[0] = 0x2c;
  local_1c = 0xb;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,int,int>
            ("span[0]","11",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/span_suite.cpp"
             ,0xb0,"void api_dynamic_suite::dynamic_operator_index_const()",&local_38,&local_1c);
  local_1c = 0x16;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,int,int>
            ("span[1]","22",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/span_suite.cpp"
             ,0xb1,"void api_dynamic_suite::dynamic_operator_index_const()",&uStack_34,&local_1c);
  local_1c = 0x21;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,int,int>
            ("span[2]","33",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/span_suite.cpp"
             ,0xb2,"void api_dynamic_suite::dynamic_operator_index_const()",&uStack_30,&local_1c);
  local_1c = 0x2c;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,int,int>
            ("span[3]","44",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/span_suite.cpp"
             ,0xb3,"void api_dynamic_suite::dynamic_operator_index_const()",auStack_2c,&local_1c);
  return;
}

Assistant:

void dynamic_operator_index_const()
{
    int array[4] = { 11, 22, 33, 44 };
    const vista::span<int> span(array);
    BOOST_TEST_EQ(span[0], 11);
    BOOST_TEST_EQ(span[1], 22);
    BOOST_TEST_EQ(span[2], 33);
    BOOST_TEST_EQ(span[3], 44);
}